

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O0

void aggregate_mask_proc(Am_Object *self,Am_Drawonable *drawonable,int x_offset,int y_offset)

{
  Am_Method_Wrapper *pAVar1;
  bool bVar2;
  int iVar3;
  uint x_offset_00;
  uint y_offset_00;
  uint uVar4;
  uint uVar5;
  Am_Value *pAVar6;
  Am_Ptr ptr;
  Am_Object local_78;
  undefined1 local_70 [8];
  Am_Draw_Method draw_method;
  Am_State_Store *state;
  Am_Object local_48;
  Am_Object item;
  Am_Value_List components;
  int height;
  int width;
  int top;
  int left;
  int y_offset_local;
  int x_offset_local;
  Am_Drawonable *drawonable_local;
  Am_Object *self_local;
  
  pAVar6 = Am_Object::Get(self,100,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar6);
  x_offset_00 = iVar3 + x_offset;
  pAVar6 = Am_Object::Get(self,0x65,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar6);
  y_offset_00 = iVar3 + y_offset;
  pAVar6 = Am_Object::Get(self,0x66,0);
  uVar4 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(self,0x67,0);
  uVar5 = Am_Value::operator_cast_to_int(pAVar6);
  if ((uVar4 != 0) && (uVar5 != 0)) {
    (*drawonable->_vptr_Am_Drawonable[0x21])
              (drawonable,(ulong)x_offset_00,(ulong)y_offset_00,(ulong)uVar4,(ulong)uVar5);
    pAVar6 = Am_Object::Get(self,0x82,0);
    Am_Value_List::Am_Value_List((Am_Value_List *)&item,pAVar6);
    Am_Object::Am_Object(&local_48);
    Am_Value_List::Start((Am_Value_List *)&item);
    while (bVar2 = Am_Value_List::Last((Am_Value_List *)&item), ((bVar2 ^ 0xffU) & 1) != 0) {
      pAVar6 = Am_Value_List::Get((Am_Value_List *)&item);
      Am_Object::operator=(&local_48,pAVar6);
      pAVar6 = Am_Object::Get(&local_48,0x7d8,0);
      ptr = Am_Value::operator_cast_to_void_(pAVar6);
      draw_method.Call = (Am_Draw_Method_Type *)Am_State_Store::Narrow(ptr);
      bVar2 = Am_State_Store::Visible
                        ((Am_State_Store *)draw_method.Call,drawonable,x_offset_00,y_offset_00);
      if (bVar2) {
        pAVar6 = Am_Object::Get(&local_48,0x7d1,0);
        Am_Draw_Method::Am_Draw_Method((Am_Draw_Method *)local_70,pAVar6);
        pAVar1 = draw_method.from_wrapper;
        Am_Object::Am_Object(&local_78,&local_48);
        (*(code *)pAVar1)(&local_78,drawonable,x_offset_00,y_offset_00);
        Am_Object::~Am_Object(&local_78);
      }
      Am_Value_List::Next((Am_Value_List *)&item);
    }
    (*drawonable->_vptr_Am_Drawonable[0x22])();
    Am_Object::~Am_Object(&local_48);
    Am_Value_List::~Am_Value_List((Am_Value_List *)&item);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, aggregate_mask,
                 (Am_Object self, Am_Drawonable *drawonable, int x_offset,
                  int y_offset))
{
  int left = (int)self.Get(Am_LEFT) + x_offset;
  int top = (int)self.Get(Am_TOP) + y_offset;
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);
  if (width && height) {
    drawonable->Push_Clip(left, top, width, height);
    Am_Value_List components = self.Get(Am_GRAPHICAL_PARTS);
    Am_Object item;
    for (components.Start(); !components.Last(); components.Next()) {
      item = components.Get();
      Am_State_Store *state = Am_State_Store::Narrow(item.Get(Am_PREV_STATE));
      if (state->Visible(drawonable, left, top)) {
        Am_Draw_Method draw_method = item.Get(Am_MASK_METHOD);
        draw_method.Call(item, drawonable, left, top);
      }
    }
    drawonable->Pop_Clip();
  }
}